

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void run_ellswift_tests(void)

{
  uchar *ell_a64;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uchar *ell_b64;
  undefined8 uVar6;
  secp256k1_fe *psVar7;
  uchar *s2;
  ulong uVar8;
  long lVar9;
  secp256k1_pubkey *psVar10;
  char *pcVar11;
  secp256k1_fe *b;
  bool bVar12;
  secp256k1_ellswift_xdh_hash_function local_470;
  secp256k1_scalar sec_1;
  uchar sec32b [32];
  uchar share32a [32];
  uchar sec32_1 [32];
  secp256k1_scalar sec;
  uchar share32 [32];
  secp256k1_fe x2;
  uchar share32_bad [32];
  uchar share32b [32];
  uchar sec32b_bad [32];
  uchar sec32a_bad [32];
  uchar rnd32 [32];
  secp256k1_pubkey pubkey2;
  secp256k1_pubkey pubkey_1;
  uchar ell64 [64];
  secp256k1_fe t;
  secp256k1_fe local_d8 [2];
  secp256k1_scalar secb;
  secp256k1_scalar seca;
  
  psVar7 = ellswift_xswiftec_inv_tests[0].encs;
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
    b = psVar7;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      uVar1 = secp256k1_ellswift_xswiftec_inv_var
                        (&t,&ellswift_xswiftec_inv_tests[lVar5].x,
                         &ellswift_xswiftec_inv_tests[lVar5].u,(uint)lVar9);
      if (uVar1 != (((uint)ellswift_xswiftec_inv_tests[lVar5].enc_bitmap >> ((uint)lVar9 & 0x1f) & 1
                    ) != 0)) {
        pcVar11 = "test condition failed: ret == ((testcase->enc_bitmap >> c) & 1)";
        uVar6 = 0xbc;
        goto LAB_0010aac8;
      }
      if (uVar1 != 0) {
        iVar2 = fe_equal(&t,b);
        if (iVar2 == 0) {
          pcVar11 = "test condition failed: fe_equal(&t, &testcase->encs[c])";
          uVar6 = 0xbf;
          goto LAB_0010aac8;
        }
        secp256k1_ellswift_xswiftec_var(&x2,&ellswift_xswiftec_inv_tests[lVar5].u,b);
        iVar2 = fe_equal(&ellswift_xswiftec_inv_tests[lVar5].x,&x2);
        if (iVar2 == 0) {
          pcVar11 = "test condition failed: fe_equal(&testcase->x, &x2)";
          uVar6 = 0xc1;
          goto LAB_0010aac8;
        }
      }
      b = b + 1;
    }
    psVar7 = (secp256k1_fe *)(psVar7[10].n + 1);
  }
  lVar5 = 0x4c;
  psVar7 = &ellswift_decode_tests[0].x;
  while (bVar12 = lVar5 != 0, lVar5 = lVar5 + -1, bVar12) {
    iVar2 = secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)&x2,(uchar *)(psVar7[-2].n + 4));
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0xcb;
      goto LAB_0010aac8;
    }
    iVar2 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)&t,(secp256k1_pubkey *)&x2);
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0xcd;
      goto LAB_0010aac8;
    }
    iVar2 = fe_equal(psVar7,&t);
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: fe_equal(&testcase->x, &ge.x)";
      uVar6 = 0xce;
      goto LAB_0010aac8;
    }
    iVar2 = secp256k1_fe_is_odd(local_d8);
    if (iVar2 != (int)psVar7[1].n[0]) {
      pcVar11 = "test condition failed: secp256k1_fe_is_odd(&ge.y) == testcase->odd_y";
      uVar6 = 0xcf;
      goto LAB_0010aac8;
    }
    psVar7 = (secp256k1_fe *)(psVar7[2].n + 3);
  }
  lVar5 = 7;
  s2 = ellswift_xdh_tests_bip324[0].shared_secret;
  while (bVar12 = lVar5 != 0, lVar5 = lVar5 + -1, bVar12) {
    ell_b64 = s2 + -0x44;
    ell_a64 = s2 + -0x84;
    if (*(int *)(s2 + -4) == 0) {
      ell_b64 = s2 + -0x84;
      ell_a64 = s2 + -0x44;
    }
    iVar2 = secp256k1_ellswift_xdh
                      (CTX,(uchar *)&t,ell_a64,ell_b64,(uchar *)(s2 + -0xa4),
                       (uint)(*(int *)(s2 + -4) == 0),ellswift_xdh_hash_function_bip324,(void *)0x0)
    ;
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0xde;
      goto LAB_0010aac8;
    }
    iVar2 = secp256k1_memcmp_var(&t,s2,0x20);
    if (iVar2 != 0) {
      pcVar11 = 
      "test condition failed: secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0";
      uVar6 = 0xdf;
      goto LAB_0010aac8;
    }
    s2 = s2 + 0xc4;
  }
  for (iVar2 = 0; iVar2 < COUNT * 1000; iVar2 = iVar2 + 1) {
    testutil_random_ge_test((secp256k1_ge *)&t);
    secp256k1_ge_to_bytes(pubkey_1.data,(secp256k1_ge *)&t);
    testrand256(rnd32);
    secp256k1_ellswift_encode(CTX,ell64,&pubkey_1,rnd32);
    secp256k1_ellswift_decode(CTX,&pubkey2,ell64);
    secp256k1_pubkey_load(CTX,(secp256k1_ge *)&x2,&pubkey2);
    iVar3 = secp256k1_ge_eq_var((secp256k1_ge *)&t,(secp256k1_ge *)&x2);
    if (iVar3 == 0) {
      pcVar11 = "test condition failed: secp256k1_ge_eq_var(&g, &g2)";
      uVar6 = 0xf0;
      goto LAB_0010aac8;
    }
  }
  for (uVar1 = 0; SBORROW4(uVar1,COUNT * 400) != (int)(uVar1 + COUNT * -400) < 0; uVar1 = uVar1 + 1)
  {
    if ((uVar1 & 1) == 0) {
      psVar10 = (secp256k1_pubkey *)0x0;
    }
    else {
      psVar10 = &pubkey2;
      testrand256_test(psVar10->data);
    }
    testutil_random_scalar_order_test(&sec);
    secp256k1_scalar_get_b32(rnd32,&sec);
    iVar2 = secp256k1_ellswift_create(CTX,pubkey_1.data,rnd32,psVar10->data);
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x101;
      goto LAB_0010aac8;
    }
    secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)ell64,pubkey_1.data);
    secp256k1_pubkey_load(CTX,(secp256k1_ge *)&x2,(secp256k1_pubkey *)ell64);
    secp256k1_ecmult((secp256k1_gej *)&t,(secp256k1_gej *)0x0,&secp256k1_scalar_zero,&sec);
    iVar2 = secp256k1_gej_eq_ge_var((secp256k1_gej *)&t,(secp256k1_ge *)&x2);
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: secp256k1_gej_eq_ge_var(&res, &dec)";
      uVar6 = 0x106;
      goto LAB_0010aac8;
    }
  }
  for (uVar1 = 0; (int)uVar1 < COUNT * 800; uVar1 = uVar1 + 1) {
    testutil_random_scalar_order_test(&sec_1);
    secp256k1_scalar_get_b32(sec32_1,&sec_1);
    testrand256_test(pubkey2.data);
    testrand256_test(pubkey2.data + 0x20);
    secp256k1_ellswift_decode(CTX,(secp256k1_pubkey *)rnd32,pubkey2.data);
    secp256k1_pubkey_load(CTX,(secp256k1_ge *)ell64,(secp256k1_pubkey *)rnd32);
    secp256k1_gej_set_ge((secp256k1_gej *)&t,(secp256k1_ge *)ell64);
    iVar2 = secp256k1_ellswift_xdh
                      (CTX,share32,pubkey2.data,pubkey2.data,sec32_1,uVar1 & 1,ellswift_xdh_hash_x32
                       ,(void *)0x0);
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x11e;
      goto LAB_0010aac8;
    }
    secp256k1_fe_set_b32_limit((secp256k1_fe *)&sec,share32);
    secp256k1_fe_verify((secp256k1_fe *)&sec);
    secp256k1_ecmult((secp256k1_gej *)&x2,(secp256k1_gej *)&t,&sec_1,(secp256k1_scalar *)0x0);
    secp256k1_ge_set_gej((secp256k1_ge *)&pubkey_1,(secp256k1_gej *)&x2);
    iVar2 = fe_equal((secp256k1_fe *)&pubkey_1,(secp256k1_fe *)&sec);
    if (iVar2 == 0) {
      pcVar11 = "test condition failed: fe_equal(&res.x, &share_x)";
      uVar6 = 0x125;
      goto LAB_0010aac8;
    }
  }
  uVar8 = 0;
  do {
    iVar2 = (int)uVar8;
    if (COUNT * 200 <= iVar2) {
      secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_encode",0x19);
      secp256k1_ellswift_sha256_init_encode((secp256k1_sha256 *)&x2);
      test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
      secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"secp256k1_ellswift_create",0x19);
      secp256k1_ellswift_sha256_init_create((secp256k1_sha256 *)&x2);
      test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
      secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)&t,"bip324_ellswift_xonly_ecdh",0x1a);
      secp256k1_ellswift_sha256_init_bip324((secp256k1_sha256 *)&x2);
      test_sha256_eq((secp256k1_sha256 *)&t,(secp256k1_sha256 *)&x2);
      return;
    }
    iVar3 = (int)(uVar8 / 3) * 3;
    if (iVar3 == iVar2) {
      local_470 = ellswift_xdh_hash_x32;
LAB_0010a42c:
      psVar10 = (secp256k1_pubkey *)0x0;
    }
    else {
      if (iVar3 + 1 == iVar2) {
        local_470 = ellswift_xdh_hash_function_bip324;
        goto LAB_0010a42c;
      }
      psVar10 = &pubkey2;
      testrand256_test(psVar10->data);
      testrand256_test(pubkey2.data + 0x20);
      local_470 = ellswift_xdh_hash_function_prefix;
    }
    testrand256_test(rnd32);
    testrand256_test((uchar *)&sec);
    testutil_random_scalar_order_test(&seca);
    testutil_random_scalar_order(&secb);
    secp256k1_scalar_get_b32((uchar *)&sec_1,&seca);
    secp256k1_scalar_get_b32(sec32b,&secb);
    iVar4 = secp256k1_ellswift_create(CTX,(uchar *)&t,(uchar *)&sec_1,rnd32);
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x14e;
LAB_0010aac8:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,uVar6,pcVar11);
      abort();
    }
    iVar4 = secp256k1_ellswift_create(CTX,(uchar *)&x2,sec32b,(uchar *)&sec);
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x151;
      goto LAB_0010aac8;
    }
    iVar4 = secp256k1_ellswift_xdh
                      (CTX,share32a,(uchar *)&t,(uchar *)&x2,(uchar *)&sec_1,0,local_470,psVar10);
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x156;
      goto LAB_0010aac8;
    }
    iVar4 = secp256k1_ellswift_xdh(CTX,share32b,(uchar *)&t,(uchar *)&x2,sec32b,1,local_470,psVar10)
    ;
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x159;
      goto LAB_0010aac8;
    }
    iVar4 = secp256k1_memcmp_var(share32a,share32b,0x20);
    if (iVar4 != 0) {
      pcVar11 = "test condition failed: secp256k1_memcmp_var(share32a, share32b, 32) == 0";
      uVar6 = 0x15b;
      goto LAB_0010aac8;
    }
    pubkey_1.data[0x20] = (undefined1)x2.n[4];
    pubkey_1.data[0x21] = x2.n[4]._1_1_;
    pubkey_1.data[0x22] = x2.n[4]._2_1_;
    pubkey_1.data[0x23] = x2.n[4]._3_1_;
    pubkey_1.data[0x24] = x2.n[4]._4_1_;
    pubkey_1.data[0x25] = x2.n[4]._5_1_;
    pubkey_1.data[0x26] = x2.n[4]._6_1_;
    pubkey_1.data[0x27] = x2.n[4]._7_1_;
    pubkey_1.data._40_8_ = x2._40_8_;
    pubkey_1.data[0x10] = (undefined1)x2.n[2];
    pubkey_1.data[0x11] = x2.n[2]._1_1_;
    pubkey_1.data[0x12] = x2.n[2]._2_1_;
    pubkey_1.data[0x13] = x2.n[2]._3_1_;
    pubkey_1.data[0x14] = x2.n[2]._4_1_;
    pubkey_1.data[0x15] = x2.n[2]._5_1_;
    pubkey_1.data[0x16] = x2.n[2]._6_1_;
    pubkey_1.data[0x17] = x2.n[2]._7_1_;
    pubkey_1.data[0x18] = (undefined1)x2.n[3];
    pubkey_1.data[0x19] = x2.n[3]._1_1_;
    pubkey_1.data[0x1a] = x2.n[3]._2_1_;
    pubkey_1.data[0x1b] = x2.n[3]._3_1_;
    pubkey_1.data[0x1c] = x2.n[3]._4_1_;
    pubkey_1.data[0x1d] = x2.n[3]._5_1_;
    pubkey_1.data[0x1e] = x2.n[3]._6_1_;
    pubkey_1.data[0x1f] = x2.n[3]._7_1_;
    pubkey_1.data[0] = (undefined1)x2.n[0];
    pubkey_1.data[1] = x2.n[0]._1_1_;
    pubkey_1.data[2] = x2.n[0]._2_1_;
    pubkey_1.data[3] = x2.n[0]._3_1_;
    pubkey_1.data[4] = x2.n[0]._4_1_;
    pubkey_1.data[5] = x2.n[0]._5_1_;
    pubkey_1.data[6] = x2.n[0]._6_1_;
    pubkey_1.data[7] = x2.n[0]._7_1_;
    pubkey_1.data[8] = (undefined1)x2.n[1];
    pubkey_1.data[9] = x2.n[1]._1_1_;
    pubkey_1.data[10] = x2.n[1]._2_1_;
    pubkey_1.data[0xb] = x2.n[1]._3_1_;
    pubkey_1.data[0xc] = x2.n[1]._4_1_;
    pubkey_1.data[0xd] = x2.n[1]._5_1_;
    pubkey_1.data[0xe] = x2.n[1]._6_1_;
    pubkey_1.data[0xf] = x2.n[1]._7_1_;
    testrand_flip(pubkey_1.data,0x40);
    iVar4 = secp256k1_ellswift_xdh
                      (CTX,share32_bad,(uchar *)&t,pubkey_1.data,(uchar *)&sec_1,0,local_470,psVar10
                      );
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x162;
      goto LAB_0010aac8;
    }
    iVar4 = secp256k1_memcmp_var(share32_bad,share32a,0x20);
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: secp256k1_memcmp_var(share32_bad, share32a, 32) != 0";
      uVar6 = 0x163;
      goto LAB_0010aac8;
    }
    ell64[0x30] = (undefined1)local_d8[0].n[0];
    ell64[0x31] = local_d8[0].n[0]._1_1_;
    ell64[0x32] = local_d8[0].n[0]._2_1_;
    ell64[0x33] = local_d8[0].n[0]._3_1_;
    ell64[0x34] = local_d8[0].n[0]._4_1_;
    ell64[0x35] = local_d8[0].n[0]._5_1_;
    ell64[0x36] = local_d8[0].n[0]._6_1_;
    ell64[0x37] = local_d8[0].n[0]._7_1_;
    ell64[0x38] = (undefined1)local_d8[0].n[1];
    ell64[0x39] = local_d8[0].n[1]._1_1_;
    ell64[0x3a] = local_d8[0].n[1]._2_1_;
    ell64[0x3b] = local_d8[0].n[1]._3_1_;
    ell64[0x3c] = local_d8[0].n[1]._4_1_;
    ell64[0x3d] = local_d8[0].n[1]._5_1_;
    ell64[0x3e] = local_d8[0].n[1]._6_1_;
    ell64[0x3f] = local_d8[0].n[1]._7_1_;
    ell64[0x20] = (undefined1)t.n[4];
    ell64[0x21] = t.n[4]._1_1_;
    ell64[0x22] = t.n[4]._2_1_;
    ell64[0x23] = t.n[4]._3_1_;
    ell64[0x24] = t.n[4]._4_1_;
    ell64[0x25] = t.n[4]._5_1_;
    ell64[0x26] = t.n[4]._6_1_;
    ell64[0x27] = t.n[4]._7_1_;
    ell64._40_8_ = t._40_8_;
    ell64[0x10] = (undefined1)t.n[2];
    ell64[0x11] = t.n[2]._1_1_;
    ell64[0x12] = t.n[2]._2_1_;
    ell64[0x13] = t.n[2]._3_1_;
    ell64[0x14] = t.n[2]._4_1_;
    ell64[0x15] = t.n[2]._5_1_;
    ell64[0x16] = t.n[2]._6_1_;
    ell64[0x17] = t.n[2]._7_1_;
    ell64[0x18] = (undefined1)t.n[3];
    ell64[0x19] = t.n[3]._1_1_;
    ell64[0x1a] = t.n[3]._2_1_;
    ell64[0x1b] = t.n[3]._3_1_;
    ell64[0x1c] = t.n[3]._4_1_;
    ell64[0x1d] = t.n[3]._5_1_;
    ell64[0x1e] = t.n[3]._6_1_;
    ell64[0x1f] = t.n[3]._7_1_;
    ell64[0] = (undefined1)t.n[0];
    ell64[1] = t.n[0]._1_1_;
    ell64[2] = t.n[0]._2_1_;
    ell64[3] = t.n[0]._3_1_;
    ell64[4] = t.n[0]._4_1_;
    ell64[5] = t.n[0]._5_1_;
    ell64[6] = t.n[0]._6_1_;
    ell64[7] = t.n[0]._7_1_;
    ell64[8] = (undefined1)t.n[1];
    ell64[9] = t.n[1]._1_1_;
    ell64[10] = t.n[1]._2_1_;
    ell64[0xb] = t.n[1]._3_1_;
    ell64[0xc] = t.n[1]._4_1_;
    ell64[0xd] = t.n[1]._5_1_;
    ell64[0xe] = t.n[1]._6_1_;
    ell64[0xf] = t.n[1]._7_1_;
    testrand_flip(ell64,0x40);
    iVar4 = secp256k1_ellswift_xdh(CTX,share32_bad,ell64,(uchar *)&x2,sec32b,1,local_470,psVar10);
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: ret";
      uVar6 = 0x168;
      goto LAB_0010aac8;
    }
    iVar4 = secp256k1_memcmp_var(share32_bad,share32b,0x20);
    if (iVar4 == 0) {
      pcVar11 = "test condition failed: secp256k1_memcmp_var(share32_bad, share32b, 32) != 0";
      uVar6 = 0x169;
      goto LAB_0010aac8;
    }
    sec32a_bad[0x10] = (undefined1)sec_1.d[2];
    sec32a_bad[0x11] = sec_1.d[2]._1_1_;
    sec32a_bad[0x12] = sec_1.d[2]._2_1_;
    sec32a_bad[0x13] = sec_1.d[2]._3_1_;
    sec32a_bad[0x14] = sec_1.d[2]._4_1_;
    sec32a_bad[0x15] = sec_1.d[2]._5_1_;
    sec32a_bad[0x16] = sec_1.d[2]._6_1_;
    sec32a_bad[0x17] = sec_1.d[2]._7_1_;
    sec32a_bad[0x18] = (undefined1)sec_1.d[3];
    sec32a_bad[0x19] = sec_1.d[3]._1_1_;
    sec32a_bad[0x1a] = sec_1.d[3]._2_1_;
    sec32a_bad[0x1b] = sec_1.d[3]._3_1_;
    sec32a_bad[0x1c] = sec_1.d[3]._4_1_;
    sec32a_bad[0x1d] = sec_1.d[3]._5_1_;
    sec32a_bad[0x1e] = sec_1.d[3]._6_1_;
    sec32a_bad[0x1f] = sec_1.d[3]._7_1_;
    sec32a_bad[0] = (undefined1)sec_1.d[0];
    sec32a_bad[1] = sec_1.d[0]._1_1_;
    sec32a_bad[2] = sec_1.d[0]._2_1_;
    sec32a_bad[3] = sec_1.d[0]._3_1_;
    sec32a_bad[4] = sec_1.d[0]._4_1_;
    sec32a_bad[5] = sec_1.d[0]._5_1_;
    sec32a_bad[6] = sec_1.d[0]._6_1_;
    sec32a_bad[7] = sec_1.d[0]._7_1_;
    sec32a_bad[8] = (undefined1)sec_1.d[1];
    sec32a_bad[9] = sec_1.d[1]._1_1_;
    sec32a_bad[10] = sec_1.d[1]._2_1_;
    sec32a_bad[0xb] = sec_1.d[1]._3_1_;
    sec32a_bad[0xc] = sec_1.d[1]._4_1_;
    sec32a_bad[0xd] = sec_1.d[1]._5_1_;
    sec32a_bad[0xe] = sec_1.d[1]._6_1_;
    sec32a_bad[0xf] = sec_1.d[1]._7_1_;
    testrand_flip(sec32a_bad,0x20);
    iVar4 = secp256k1_ellswift_xdh
                      (CTX,share32_bad,(uchar *)&t,(uchar *)&x2,sec32a_bad,0,local_470,psVar10);
    if ((iVar4 != 0) && (iVar4 = secp256k1_memcmp_var(share32_bad,share32a,0x20), iVar4 == 0)) {
      pcVar11 = 
      "test condition failed: !ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0";
      uVar6 = 0x170;
      goto LAB_0010aac8;
    }
    sec32b_bad[0x10] = sec32b[0x10];
    sec32b_bad[0x11] = sec32b[0x11];
    sec32b_bad[0x12] = sec32b[0x12];
    sec32b_bad[0x13] = sec32b[0x13];
    sec32b_bad[0x14] = sec32b[0x14];
    sec32b_bad[0x15] = sec32b[0x15];
    sec32b_bad[0x16] = sec32b[0x16];
    sec32b_bad[0x17] = sec32b[0x17];
    sec32b_bad[0x18] = sec32b[0x18];
    sec32b_bad[0x19] = sec32b[0x19];
    sec32b_bad[0x1a] = sec32b[0x1a];
    sec32b_bad[0x1b] = sec32b[0x1b];
    sec32b_bad[0x1c] = sec32b[0x1c];
    sec32b_bad[0x1d] = sec32b[0x1d];
    sec32b_bad[0x1e] = sec32b[0x1e];
    sec32b_bad[0x1f] = sec32b[0x1f];
    sec32b_bad[0] = sec32b[0];
    sec32b_bad[1] = sec32b[1];
    sec32b_bad[2] = sec32b[2];
    sec32b_bad[3] = sec32b[3];
    sec32b_bad[4] = sec32b[4];
    sec32b_bad[5] = sec32b[5];
    sec32b_bad[6] = sec32b[6];
    sec32b_bad[7] = sec32b[7];
    sec32b_bad[8] = sec32b[8];
    sec32b_bad[9] = sec32b[9];
    sec32b_bad[10] = sec32b[10];
    sec32b_bad[0xb] = sec32b[0xb];
    sec32b_bad[0xc] = sec32b[0xc];
    sec32b_bad[0xd] = sec32b[0xd];
    sec32b_bad[0xe] = sec32b[0xe];
    sec32b_bad[0xf] = sec32b[0xf];
    testrand_flip(sec32b_bad,0x20);
    iVar4 = secp256k1_ellswift_xdh
                      (CTX,share32_bad,(uchar *)&t,(uchar *)&x2,sec32b_bad,1,local_470,psVar10);
    if ((iVar4 != 0) && (iVar4 = secp256k1_memcmp_var(share32_bad,share32b,0x20), iVar4 == 0)) {
      pcVar11 = 
      "test condition failed: !ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0";
      uVar6 = 0x175;
      goto LAB_0010aac8;
    }
    if (iVar3 != iVar2) {
      share32[0x10] = (undefined1)sec.d[2];
      share32[0x11] = sec.d[2]._1_1_;
      share32[0x12] = sec.d[2]._2_1_;
      share32[0x13] = sec.d[2]._3_1_;
      share32[0x14] = sec.d[2]._4_1_;
      share32[0x15] = sec.d[2]._5_1_;
      share32[0x16] = sec.d[2]._6_1_;
      share32[0x17] = sec.d[2]._7_1_;
      share32[0x18] = (undefined1)sec.d[3];
      share32[0x19] = sec.d[3]._1_1_;
      share32[0x1a] = sec.d[3]._2_1_;
      share32[0x1b] = sec.d[3]._3_1_;
      share32[0x1c] = sec.d[3]._4_1_;
      share32[0x1d] = sec.d[3]._5_1_;
      share32[0x1e] = sec.d[3]._6_1_;
      share32[0x1f] = sec.d[3]._7_1_;
      share32[0] = (undefined1)sec.d[0];
      share32[1] = sec.d[0]._1_1_;
      share32[2] = sec.d[0]._2_1_;
      share32[3] = sec.d[0]._3_1_;
      share32[4] = sec.d[0]._4_1_;
      share32[5] = sec.d[0]._5_1_;
      share32[6] = sec.d[0]._6_1_;
      share32[7] = sec.d[0]._7_1_;
      share32[8] = (undefined1)sec.d[1];
      share32[9] = sec.d[1]._1_1_;
      share32[10] = sec.d[1]._2_1_;
      share32[0xb] = sec.d[1]._3_1_;
      share32[0xc] = sec.d[1]._4_1_;
      share32[0xd] = sec.d[1]._5_1_;
      share32[0xe] = sec.d[1]._6_1_;
      share32[0xf] = sec.d[1]._7_1_;
      testrand_flip(share32,0x20);
      iVar3 = secp256k1_ellswift_create(CTX,pubkey_1.data,sec32b,share32);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: ret";
        uVar6 = 0x17d;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,pubkey_1.data,(uchar *)&sec_1,0,local_470,
                         psVar10);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: ret";
        uVar6 = 0x17f;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_memcmp_var(share32_bad,share32a,0x20);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: secp256k1_memcmp_var(share32_bad, share32a, 32) != 0";
        uVar6 = 0x180;
        goto LAB_0010aac8;
      }
      sec32_1[0x10] = rnd32[0x10];
      sec32_1[0x11] = rnd32[0x11];
      sec32_1[0x12] = rnd32[0x12];
      sec32_1[0x13] = rnd32[0x13];
      sec32_1[0x14] = rnd32[0x14];
      sec32_1[0x15] = rnd32[0x15];
      sec32_1[0x16] = rnd32[0x16];
      sec32_1[0x17] = rnd32[0x17];
      sec32_1[0x18] = rnd32[0x18];
      sec32_1[0x19] = rnd32[0x19];
      sec32_1[0x1a] = rnd32[0x1a];
      sec32_1[0x1b] = rnd32[0x1b];
      sec32_1[0x1c] = rnd32[0x1c];
      sec32_1[0x1d] = rnd32[0x1d];
      sec32_1[0x1e] = rnd32[0x1e];
      sec32_1[0x1f] = rnd32[0x1f];
      sec32_1[0] = rnd32[0];
      sec32_1[1] = rnd32[1];
      sec32_1[2] = rnd32[2];
      sec32_1[3] = rnd32[3];
      sec32_1[4] = rnd32[4];
      sec32_1[5] = rnd32[5];
      sec32_1[6] = rnd32[6];
      sec32_1[7] = rnd32[7];
      sec32_1[8] = rnd32[8];
      sec32_1[9] = rnd32[9];
      sec32_1[10] = rnd32[10];
      sec32_1[0xb] = rnd32[0xb];
      sec32_1[0xc] = rnd32[0xc];
      sec32_1[0xd] = rnd32[0xd];
      sec32_1[0xe] = rnd32[0xe];
      sec32_1[0xf] = rnd32[0xf];
      testrand_flip(sec32_1,0x20);
      iVar3 = secp256k1_ellswift_create(CTX,ell64,(uchar *)&sec_1,sec32_1);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: ret";
        uVar6 = 0x185;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_ellswift_xdh(CTX,share32_bad,ell64,(uchar *)&x2,sec32b,1,local_470,psVar10);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: ret";
        uVar6 = 0x187;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_memcmp_var(share32_bad,share32b,0x20);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: secp256k1_memcmp_var(share32_bad, share32b, 32) != 0";
        uVar6 = 0x188;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)&x2,(uchar *)&sec_1,1,local_470,
                         psVar10);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: ret";
        uVar6 = 0x18d;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_memcmp_var(share32_bad,share32a,0x20);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: secp256k1_memcmp_var(share32_bad, share32a, 32) != 0";
        uVar6 = 0x18e;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_ellswift_xdh
                        (CTX,share32_bad,(uchar *)&t,(uchar *)&x2,sec32b,0,local_470,psVar10);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: ret";
        uVar6 = 0x191;
        goto LAB_0010aac8;
      }
      iVar3 = secp256k1_memcmp_var(share32_bad,share32b,0x20);
      if (iVar3 == 0) {
        pcVar11 = "test condition failed: secp256k1_memcmp_var(share32_bad, share32b, 32) != 0";
        uVar6 = 0x192;
        goto LAB_0010aac8;
      }
    }
    uVar8 = (ulong)(iVar2 + 1);
  } while( true );
}

Assistant:

void run_ellswift_tests(void) {
    int i = 0;
    /* Test vectors. */
    for (i = 0; (unsigned)i < sizeof(ellswift_xswiftec_inv_tests) / sizeof(ellswift_xswiftec_inv_tests[0]); ++i) {
        const struct ellswift_xswiftec_inv_test *testcase = &ellswift_xswiftec_inv_tests[i];
        int c;
        for (c = 0; c < 8; ++c) {
            secp256k1_fe t;
            int ret = secp256k1_ellswift_xswiftec_inv_var(&t, &testcase->x, &testcase->u, c);
            CHECK(ret == ((testcase->enc_bitmap >> c) & 1));
            if (ret) {
                secp256k1_fe x2;
                CHECK(fe_equal(&t, &testcase->encs[c]));
                secp256k1_ellswift_xswiftec_var(&x2, &testcase->u, &testcase->encs[c]);
                CHECK(fe_equal(&testcase->x, &x2));
            }
        }
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_decode_tests) / sizeof(ellswift_decode_tests[0]); ++i) {
        const struct ellswift_decode_test *testcase = &ellswift_decode_tests[i];
        secp256k1_pubkey pubkey;
        secp256k1_ge ge;
        int ret;
        ret = secp256k1_ellswift_decode(CTX, &pubkey, testcase->enc);
        CHECK(ret);
        ret = secp256k1_pubkey_load(CTX, &ge, &pubkey);
        CHECK(ret);
        CHECK(fe_equal(&testcase->x, &ge.x));
        CHECK(secp256k1_fe_is_odd(&ge.y) == testcase->odd_y);
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_xdh_tests_bip324) / sizeof(ellswift_xdh_tests_bip324[0]); ++i) {
        const struct ellswift_xdh_test *test = &ellswift_xdh_tests_bip324[i];
        unsigned char shared_secret[32];
        int ret;
        int party = !test->initiating;
        const unsigned char* ell_a64 = party ? test->ellswift_theirs : test->ellswift_ours;
        const unsigned char* ell_b64 = party ? test->ellswift_ours   : test->ellswift_theirs;
        ret = secp256k1_ellswift_xdh(CTX, shared_secret,
                                     ell_a64, ell_b64,
                                     test->priv_ours,
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0);
    }
    /* Verify that secp256k1_ellswift_encode + decode roundtrips. */
    for (i = 0; i < 1000 * COUNT; i++) {
        unsigned char rnd32[32];
        unsigned char ell64[64];
        secp256k1_ge g, g2;
        secp256k1_pubkey pubkey, pubkey2;
        /* Generate random public key and random randomizer. */
        testutil_random_ge_test(&g);
        secp256k1_pubkey_save(&pubkey, &g);
        testrand256(rnd32);
        /* Convert the public key to ElligatorSwift and back. */
        secp256k1_ellswift_encode(CTX, ell64, &pubkey, rnd32);
        secp256k1_ellswift_decode(CTX, &pubkey2, ell64);
        secp256k1_pubkey_load(CTX, &g2, &pubkey2);
        /* Compare with original. */
        CHECK(secp256k1_ge_eq_var(&g, &g2));
    }
    /* Verify the behavior of secp256k1_ellswift_create */
    for (i = 0; i < 400 * COUNT; i++) {
        unsigned char auxrnd32[32], sec32[32];
        secp256k1_scalar sec;
        secp256k1_gej res;
        secp256k1_ge dec;
        secp256k1_pubkey pub;
        unsigned char ell64[64];
        int ret;
        /* Generate random secret key and random randomizer. */
        if (i & 1) testrand256_test(auxrnd32);
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Construct ElligatorSwift-encoded public keys for that key. */
        ret = secp256k1_ellswift_create(CTX, ell64, sec32, (i & 1) ? auxrnd32 : NULL);
        CHECK(ret);
        /* Decode it, and compare with traditionally-computed public key. */
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_ecmult(&res, NULL, &secp256k1_scalar_zero, &sec);
        CHECK(secp256k1_gej_eq_ge_var(&res, &dec));
    }
    /* Verify that secp256k1_ellswift_xdh computes the right shared X coordinate. */
    for (i = 0; i < 800 * COUNT; i++) {
        unsigned char ell64[64], sec32[32], share32[32];
        secp256k1_scalar sec;
        secp256k1_ge dec, res;
        secp256k1_fe share_x;
        secp256k1_gej decj, resj;
        secp256k1_pubkey pub;
        int ret;
        /* Generate random secret key. */
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Generate random ElligatorSwift encoding for the remote key and decode it. */
        testrand256_test(ell64);
        testrand256_test(ell64 + 32);
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_gej_set_ge(&decj, &dec);
        /* Compute the X coordinate of seckey*pubkey using ellswift_xdh. Note that we
         * pass ell64 as claimed (but incorrect) encoding for sec32 here; this works
         * because the "hasher" function we use here ignores the ell64 arguments. */
        ret = secp256k1_ellswift_xdh(CTX, share32, ell64, ell64, sec32, i & 1, &ellswift_xdh_hash_x32, NULL);
        CHECK(ret);
        (void)secp256k1_fe_set_b32_limit(&share_x, share32); /* no overflow is possible */
        SECP256K1_FE_VERIFY(&share_x);
        /* Compute seckey*pubkey directly. */
        secp256k1_ecmult(&resj, &decj, &sec, NULL);
        secp256k1_ge_set_gej(&res, &resj);
        /* Compare. */
        CHECK(fe_equal(&res.x, &share_x));
    }
    /* Verify the joint behavior of secp256k1_ellswift_xdh */
    for (i = 0; i < 200 * COUNT; i++) {
        unsigned char auxrnd32a[32], auxrnd32b[32], auxrnd32a_bad[32], auxrnd32b_bad[32];
        unsigned char sec32a[32], sec32b[32], sec32a_bad[32], sec32b_bad[32];
        secp256k1_scalar seca, secb;
        unsigned char ell64a[64], ell64b[64], ell64a_bad[64], ell64b_bad[64];
        unsigned char share32a[32], share32b[32], share32_bad[32];
        unsigned char prefix64[64];
        secp256k1_ellswift_xdh_hash_function hash_function;
        void* data;
        int ret;

        /* Pick hasher to use. */
        if ((i % 3) == 0) {
            hash_function = ellswift_xdh_hash_x32;
            data = NULL;
        } else if ((i % 3) == 1) {
            hash_function = secp256k1_ellswift_xdh_hash_function_bip324;
            data = NULL;
        } else {
            hash_function = secp256k1_ellswift_xdh_hash_function_prefix;
            testrand256_test(prefix64);
            testrand256_test(prefix64 + 32);
            data = prefix64;
        }

        /* Generate random secret keys and random randomizers. */
        testrand256_test(auxrnd32a);
        testrand256_test(auxrnd32b);
        testutil_random_scalar_order_test(&seca);
        /* Draw secb uniformly at random to make sure that the secret keys
         * differ */
        testutil_random_scalar_order(&secb);
        secp256k1_scalar_get_b32(sec32a, &seca);
        secp256k1_scalar_get_b32(sec32b, &secb);

        /* Construct ElligatorSwift-encoded public keys for those keys. */
        /* For A: */
        ret = secp256k1_ellswift_create(CTX, ell64a, sec32a, auxrnd32a);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_create(CTX, ell64b, sec32b, auxrnd32b);
        CHECK(ret);

        /* Compute the shared secret both ways and compare with each other. */
        /* For A: */
        ret = secp256k1_ellswift_xdh(CTX, share32a, ell64a, ell64b, sec32a, 0, hash_function, data);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_xdh(CTX, share32b, ell64a, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        /* And compare: */
        CHECK(secp256k1_memcmp_var(share32a, share32b, 32) == 0);

        /* Verify that the shared secret doesn't match if other side's public key is incorrect. */
        /* For A (using a bad public key for B): */
        memcpy(ell64b_bad, ell64b, sizeof(ell64a_bad));
        testrand_flip(ell64b_bad, sizeof(ell64b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
        CHECK(ret); /* Mismatching encodings don't get detected by secp256k1_ellswift_xdh. */
        CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B (using a bad public key for A): */
        memcpy(ell64a_bad, ell64a, sizeof(ell64a_bad));
        testrand_flip(ell64a_bad, sizeof(ell64a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        /* Verify that the shared secret doesn't match if the private key is incorrect. */
        /* For A: */
        memcpy(sec32a_bad, sec32a, sizeof(sec32a_bad));
        testrand_flip(sec32a_bad, sizeof(sec32a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a_bad, 0, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B: */
        memcpy(sec32b_bad, sec32b, sizeof(sec32b_bad));
        testrand_flip(sec32b_bad, sizeof(sec32b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b_bad, 1, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        if (hash_function != ellswift_xdh_hash_x32) {
            /* Verify that the shared secret doesn't match when a different encoding of the same public key is used. */
            /* For A (changing B's public key): */
            memcpy(auxrnd32b_bad, auxrnd32b, sizeof(auxrnd32b_bad));
            testrand_flip(auxrnd32b_bad, sizeof(auxrnd32b_bad));
            ret = secp256k1_ellswift_create(CTX, ell64b_bad, sec32b, auxrnd32b_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (changing A's public key): */
            memcpy(auxrnd32a_bad, auxrnd32a, sizeof(auxrnd32a_bad));
            testrand_flip(auxrnd32a_bad, sizeof(auxrnd32a_bad));
            ret = secp256k1_ellswift_create(CTX, ell64a_bad, sec32a, auxrnd32a_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

            /* Verify that swapping sides changes the shared secret. */
            /* For A (claiming to be B): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (claiming to be A): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);
        }
    }

    /* Test hash initializers. */
    {
        secp256k1_sha256 sha, sha_optimized;
        static const unsigned char encode_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'e', 'n', 'c', 'o', 'd', 'e'};
        static const unsigned char create_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'c', 'r', 'e', 'a', 't', 'e'};
        static const unsigned char bip324_tag[] = {'b', 'i', 'p', '3', '2', '4', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'x', 'o', 'n', 'l', 'y', '_', 'e', 'c', 'd', 'h'};

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_encode has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, encode_tag, sizeof(encode_tag));
        secp256k1_ellswift_sha256_init_encode(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_create has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, create_tag, sizeof(create_tag));
        secp256k1_ellswift_sha256_init_create(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_bip324 has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, bip324_tag, sizeof(bip324_tag));
        secp256k1_ellswift_sha256_init_bip324(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);
    }
}